

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<int,(unsigned_char)4>>
          (Thread *this)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  unsigned_short uVar1;
  int *piVar2;
  unsigned_short *puVar3;
  byte local_42;
  byte local_41;
  undefined1 auStack_40 [6];
  u8 i_1;
  u8 i;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  Simd<int,_(unsigned_char)__x04_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  for (local_41 = 0; local_41 < 4; local_41 = local_41 + 1) {
    piVar2 = Simd<int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<int,_(unsigned_char)__x04_> *)(result.v + 4),local_41);
    uVar1 = Saturate<unsigned_short,int>(*piVar2);
    puVar3 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)auStack_40,local_41);
    *puVar3 = uVar1;
  }
  for (local_42 = 0; local_42 < 4; local_42 = local_42 + 1) {
    piVar2 = Simd<int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<int,_(unsigned_char)__x04_> *)(lhs.v + 2),local_42);
    uVar1 = Saturate<unsigned_short,int>(*piVar2);
    puVar3 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)auStack_40,local_42 + 4);
    *puVar3 = uVar1;
  }
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = auStack_40._0_2_;
  value.v[1] = auStack_40._2_2_;
  value.v[2] = auStack_40._4_2_;
  value.v[3] = _i_1;
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}